

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O2

UBool icu_63::BytesTrie::findUniqueValue(uint8_t *pos,UBool haveUniqueValue,int32_t *uniqueValue)

{
  byte bVar1;
  int32_t iVar2;
  byte *pbVar3;
  
  while( true ) {
    while( true ) {
      while( true ) {
        pbVar3 = pos;
        pos = pbVar3 + 1;
        bVar1 = *pbVar3;
        if (0xf < bVar1) break;
        if ((ulong)bVar1 == 0) {
          bVar1 = pbVar3[1];
          pos = pbVar3 + 2;
        }
        pos = findUniqueValueFromBranch(pos,bVar1 + 1,haveUniqueValue,uniqueValue);
        haveUniqueValue = '\x01';
        if (pos == (byte *)0x0) {
          return '\0';
        }
      }
      if (0x1f < bVar1) break;
      pos = pos + ((ulong)bVar1 - 0xf);
    }
    iVar2 = readValue(pos,(uint)(bVar1 >> 1));
    if (haveUniqueValue == '\0') {
      *uniqueValue = iVar2;
      haveUniqueValue = '\x01';
    }
    else if (iVar2 != *uniqueValue) {
      return '\0';
    }
    if ((bVar1 & 1) != 0) break;
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        pos = pbVar3 + 2;
      }
      else if (bVar1 < 0xfc) {
        pos = pbVar3 + 3;
      }
      else {
        pos = pos + (ulong)(bVar1 >> 1 & 1) + 3;
      }
    }
  }
  return '\x01';
}

Assistant:

UBool
BytesTrie::findUniqueValue(const uint8_t *pos, UBool haveUniqueValue, int32_t &uniqueValue) {
    for(;;) {
        int32_t node=*pos++;
        if(node<kMinLinearMatch) {
            if(node==0) {
                node=*pos++;
            }
            pos=findUniqueValueFromBranch(pos, node+1, haveUniqueValue, uniqueValue);
            if(pos==NULL) {
                return FALSE;
            }
            haveUniqueValue=TRUE;
        } else if(node<kMinValueLead) {
            // linear-match node
            pos+=node-kMinLinearMatch+1;  // Ignore the match bytes.
        } else {
            UBool isFinal=(UBool)(node&kValueIsFinal);
            int32_t value=readValue(pos, node>>1);
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return FALSE;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
            if(isFinal) {
                return TRUE;
            }
            pos=skipValue(pos, node);
        }
    }
}